

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

char * blob_read_string(blob_reader *blob)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  uint8_t *nul;
  char *ret;
  int size;
  blob_reader *blob_local;
  
  if (blob->current < blob->end) {
    pvVar3 = memchr(blob->current,0,(long)blob->end - (long)blob->current);
    if (pvVar3 == (void *)0x0) {
      blob->overrun = true;
      blob_local = (blob_reader *)0x0;
    }
    else {
      iVar2 = ((int)pvVar3 - (int)blob->current) + 1;
      _Var1 = ensure_can_read(blob,(long)iVar2);
      if (!_Var1) {
        __assert_fail("ensure_can_read(blob, size)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/blob.c"
                      ,0x169,"char *blob_read_string(struct blob_reader *)");
      }
      blob_local = (blob_reader *)blob->current;
      blob->current = blob->current + iVar2;
    }
  }
  else {
    blob->overrun = true;
    blob_local = (blob_reader *)0x0;
  }
  return (char *)blob_local;
}

Assistant:

char *
blob_read_string(struct blob_reader *blob)
{
   int size;
   char *ret;
   uint8_t *nul;

   /* If we're already at the end, then this is an overrun. */
   if (blob->current >= blob->end) {
      blob->overrun = true;
      return NULL;
   }

   /* Similarly, if there is no zero byte in the data remaining in this blob,
    * we also consider that an overrun.
    */
   nul = memchr(blob->current, 0, blob->end - blob->current);

   if (nul == NULL) {
      blob->overrun = true;
      return NULL;
   }

   size = nul - blob->current + 1;

   assert(ensure_can_read(blob, size));

   ret = (char *) blob->current;

   blob->current += size;

   return ret;
}